

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

bool __thiscall
cmDependsFortran::WriteDependencies
          (cmDependsFortran *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sources,string *obj,ostream *param_3,ostream *param_4)

{
  int iVar1;
  cmFortranSourceInfo *info;
  ostream *poVar2;
  _Base_ptr p_Var3;
  char *m1;
  bool bVar4;
  _Rb_tree_header *p_Var5;
  cmFortranCompiler fc;
  cmFortranParser parser;
  undefined1 local_300 [32];
  _Alloc_hider local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Alloc_hider local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  _Rb_tree_node_base *local_2a0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_290;
  cmDependsFortran *local_288;
  undefined1 *local_280;
  long local_278;
  undefined1 local_270;
  undefined7 uStack_26f;
  undefined1 *local_260;
  long local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  undefined1 *local_240;
  long local_238;
  undefined1 local_230;
  undefined7 uStack_22f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  cmFortranParser_s local_1d8;
  
  if (((sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     ((sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent == (_Base_ptr)0x0
     )) {
    m1 = "Cannot scan dependencies without a source file.";
  }
  else {
    if (obj->_M_string_length != 0) {
      local_280 = &local_270;
      local_278 = 0;
      local_270 = 0;
      local_260 = &local_250;
      local_258 = 0;
      local_250 = 0;
      local_240 = &local_230;
      local_238 = 0;
      local_230 = 0;
      std::__cxx11::string::_M_assign((string *)&local_280);
      std::__cxx11::string::_M_assign((string *)&local_260);
      std::__cxx11::string::_M_assign((string *)&local_240);
      p_Var3 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var5 = &(sources->_M_t)._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var3 == p_Var5) {
        bVar4 = true;
      }
      else {
        local_290 = &(this->super_cmDepends).IncludePath;
        local_298 = &this->PPDefinitions;
        bVar4 = true;
        local_2a0 = &p_Var5->_M_header;
        local_288 = this;
        do {
          info = cmDependsFortranInternals::CreateObjectInfo
                           (local_288->Internal,obj,(string *)(p_Var3 + 1));
          local_300._0_8_ = local_300 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_300,local_280,local_280 + local_278);
          local_2e0._M_p = (pointer)&local_2d0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2e0,local_260,local_260 + local_258);
          local_2c0._M_p = (pointer)&local_2b0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2c0,local_240,local_240 + local_238);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_220,local_290);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_Rb_tree(&local_208,&local_298->_M_t);
          cmFortranParser_s::cmFortranParser_s
                    (&local_1d8,(cmFortranCompiler *)local_300,&local_220,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_208,info);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_208);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_220);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_p != &local_2b0) {
            operator_delete(local_2c0._M_p,local_2b0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_p != &local_2d0) {
            operator_delete(local_2e0._M_p,local_2d0._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
            operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
          }
          cmFortranParser_FilePush(&local_1d8,*(char **)(p_Var3 + 1));
          iVar1 = cmFortran_yyparse(local_1d8.Scanner);
          if (iVar1 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: failed to parse dependencies from Fortran source \'",0x3b);
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,*(char **)(p_Var3 + 1),
                                (long)p_Var3[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\': ",3);
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar2,local_1d8.Error._M_dataplus._M_p,
                                local_1d8.Error._M_string_length);
            std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
            std::ostream::put((char)poVar2);
            std::ostream::flush();
            bVar4 = false;
          }
          cmFortranParser_s::~cmFortranParser_s(&local_1d8);
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
        } while (p_Var3 != local_2a0);
      }
      if (local_240 != &local_230) {
        operator_delete(local_240,CONCAT71(uStack_22f,local_230) + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
      }
      if (local_280 == &local_270) {
        return bVar4;
      }
      operator_delete(local_280,CONCAT71(uStack_26f,local_270) + 1);
      return bVar4;
    }
    m1 = "Cannot scan dependencies without an object file.";
  }
  cmSystemTools::Error(m1,(char *)0x0,(char *)0x0,(char *)0x0);
  return false;
}

Assistant:

bool cmDependsFortran::WriteDependencies(const std::set<std::string>& sources,
                                         const std::string& obj,
                                         std::ostream& /*makeDepends*/,
                                         std::ostream& /*internalDepends*/)
{
  // Make sure this is a scanning instance.
  if (sources.empty() || sources.begin()->empty()) {
    cmSystemTools::Error("Cannot scan dependencies without a source file.");
    return false;
  }
  if (obj.empty()) {
    cmSystemTools::Error("Cannot scan dependencies without an object file.");
    return false;
  }

  cmFortranCompiler fc;
  fc.Id = this->CompilerId;
  fc.SModSep = this->SModSep;
  fc.SModExt = this->SModExt;

  bool okay = true;
  for (std::string const& src : sources) {
    // Get the information object for this source.
    cmFortranSourceInfo& info = this->Internal->CreateObjectInfo(obj, src);

    // Create the parser object. The constructor takes info by reference,
    // so we may look into the resulting objects later.
    cmFortranParser parser(fc, this->IncludePath, this->PPDefinitions, info);

    // Push on the starting file.
    cmFortranParser_FilePush(&parser, src.c_str());

    // Parse the translation unit.
    if (cmFortran_yyparse(parser.Scanner) != 0) {
      // Failed to parse the file.  Report failure to write dependencies.
      okay = false;
      /* clang-format off */
      std::cerr <<
        "warning: failed to parse dependencies from Fortran source "
        "'" << src << "': " << parser.Error << std::endl
        ;
      /* clang-format on */
    }
  }
  return okay;
}